

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::VariableStatement<tcu::Matrix<float,_3,_4>_>::doPrint
          (VariableStatement<tcu::Matrix<float,_3,_4>_> *this,ostream *os)

{
  Variable<tcu::Matrix<float,_3,_4>_> *pVVar1;
  ostream *poVar2;
  ExprBase *expr;
  Precision in_EDX;
  string local_c0;
  string local_90;
  VarType local_70;
  DeclareVariable local_58;
  ostream *local_18;
  ostream *os_local;
  VariableStatement<tcu::Matrix<float,_3,_4>_> *this_local;
  
  local_18 = os;
  os_local = (ostream *)this;
  if ((this->m_isDeclaration & 1U) == 0) {
    pVVar1 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_4>_>_>::
             operator->(&(this->m_variable).
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_4>_>_>
                       );
    Variable<tcu::Matrix<float,3,4>>::getName_abi_cxx11_(&local_c0,pVVar1);
    std::operator<<(os,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  else {
    getVarTypeOf<tcu::Matrix<float,3,4>>(&local_70,(shaderexecutor *)0x3,in_EDX);
    pVVar1 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_4>_>_>::
             operator->(&(this->m_variable).
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_4>_>_>
                       );
    Variable<tcu::Matrix<float,3,4>>::getName_abi_cxx11_(&local_90,pVVar1);
    glu::declare(&local_58,&local_70,&local_90,0);
    glu::decl::operator<<(os,&local_58);
    glu::decl::DeclareVariable::~DeclareVariable(&local_58);
    std::__cxx11::string::~string((string *)&local_90);
    glu::VarType::~VarType(&local_70);
  }
  poVar2 = std::operator<<(local_18," = ");
  expr = &de::SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_3,_4>_>_>::operator*
                    ((SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_3,_4>_>_> *)
                     &this->m_value)->super_ExprBase;
  poVar2 = shaderexecutor::operator<<(poVar2,expr);
  std::operator<<(poVar2,";\n");
  return;
}

Assistant:

void			doPrint				(ostream& os)							const
	{
		if (m_isDeclaration)
			os << glu::declare(getVarTypeOf<T>(), m_variable->getName());
		else
			os << m_variable->getName();

		os << " = " << *m_value << ";\n";
	}